

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

string * __thiscall
Catch::ExceptionTranslatorRegistry::tryTranslators_abi_cxx11_
          (string *__return_storage_ptr__,ExceptionTranslatorRegistry *this)

{
  value_type pIVar1;
  bool bVar2;
  const_reference ppIVar3;
  const_iterator cVar4;
  __normal_iterator<const_Catch::IExceptionTranslator_*const_*,_std::vector<const_Catch::IExceptionTranslator_*,_std::allocator<const_Catch::IExceptionTranslator_*>_>_>
  local_28;
  IExceptionTranslator **local_20;
  ExceptionTranslatorRegistry *local_18;
  ExceptionTranslatorRegistry *this_local;
  
  local_18 = this;
  this_local = (ExceptionTranslatorRegistry *)__return_storage_ptr__;
  bVar2 = std::
          vector<const_Catch::IExceptionTranslator_*,_std::allocator<const_Catch::IExceptionTranslator_*>_>
          ::empty(&this->m_translators);
  if (bVar2) {
    __cxa_rethrow();
  }
  ppIVar3 = std::
            vector<const_Catch::IExceptionTranslator_*,_std::allocator<const_Catch::IExceptionTranslator_*>_>
            ::operator[](&this->m_translators,0);
  pIVar1 = *ppIVar3;
  local_28._M_current =
       (IExceptionTranslator **)
       std::
       vector<const_Catch::IExceptionTranslator_*,_std::allocator<const_Catch::IExceptionTranslator_*>_>
       ::begin(&this->m_translators);
  local_20 = (IExceptionTranslator **)
             __gnu_cxx::
             __normal_iterator<const_Catch::IExceptionTranslator_*const_*,_std::vector<const_Catch::IExceptionTranslator_*,_std::allocator<const_Catch::IExceptionTranslator_*>_>_>
             ::operator+(&local_28,1);
  cVar4 = std::
          vector<const_Catch::IExceptionTranslator_*,_std::allocator<const_Catch::IExceptionTranslator_*>_>
          ::end(&this->m_translators);
  (*pIVar1->_vptr_IExceptionTranslator[2])(__return_storage_ptr__,pIVar1,local_20,cVar4._M_current);
  return __return_storage_ptr__;
}

Assistant:

std::string tryTranslators() const {
            if( m_translators.empty() )
                throw;
            else
                return m_translators[0]->translate( m_translators.begin()+1, m_translators.end() );
        }